

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASELoader.cpp
# Opt level: O0

void __thiscall Assimp::ASEImporter::GenerateDefaultMaterial(ASEImporter *this)

{
  Parser *pPVar1;
  bool bVar2;
  reference pMVar3;
  size_type sVar4;
  aiColor3D local_36c;
  aiColor3D local_360;
  aiColor3D local_354;
  reference local_348;
  Material *mat;
  allocator<char> local_329;
  string local_328;
  Material local_308;
  __normal_iterator<Assimp::ASE::Mesh_*,_std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>_>
  local_28;
  __normal_iterator<Assimp::ASE::Mesh_*,_std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>_>
  local_20;
  iterator i;
  bool bHas;
  ASEImporter *this_local;
  
  if (this->mParser != (Parser *)0x0) {
    i._M_current._7_1_ = 0;
    local_20._M_current =
         (Mesh *)std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>::begin
                           (&this->mParser->m_vMeshes);
    while( true ) {
      local_28._M_current =
           (Mesh *)std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>::end
                             (&this->mParser->m_vMeshes);
      bVar2 = __gnu_cxx::operator!=(&local_20,&local_28);
      if (!bVar2) break;
      pMVar3 = __gnu_cxx::
               __normal_iterator<Assimp::ASE::Mesh_*,_std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>_>
               ::operator*(&local_20);
      if (((pMVar3->bSkip & 1U) == 0) &&
         (pMVar3 = __gnu_cxx::
                   __normal_iterator<Assimp::ASE::Mesh_*,_std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>_>
                   ::operator*(&local_20), pMVar3->iMaterialIndex == 0xffffffff)) {
        sVar4 = std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::size
                          (&this->mParser->m_vMaterials);
        pMVar3 = __gnu_cxx::
                 __normal_iterator<Assimp::ASE::Mesh_*,_std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>_>
                 ::operator*(&local_20);
        pMVar3->iMaterialIndex = (uint)sVar4;
        i._M_current._7_1_ = 1;
      }
      __gnu_cxx::
      __normal_iterator<Assimp::ASE::Mesh_*,_std::vector<Assimp::ASE::Mesh,_std::allocator<Assimp::ASE::Mesh>_>_>
      ::operator++(&local_20);
    }
    if (((i._M_current._7_1_ & 1) != 0) ||
       (bVar2 = std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::empty
                          (&this->mParser->m_vMaterials), bVar2)) {
      pPVar1 = this->mParser;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_328,"DefaultMaterial",&local_329);
      ASE::Material::Material(&local_308,&local_328);
      std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::push_back
                (&pPVar1->m_vMaterials,&local_308);
      ASE::Material::~Material(&local_308);
      std::__cxx11::string::~string((string *)&local_328);
      std::allocator<char>::~allocator(&local_329);
      local_348 = std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::back
                            (&this->mParser->m_vMaterials);
      aiColor3D::aiColor3D(&local_354,0.6,0.6,0.6);
      aiColor3D::operator=(&(local_348->super_Material).mDiffuse,&local_354);
      aiColor3D::aiColor3D(&local_360,1.0,1.0,1.0);
      aiColor3D::operator=(&(local_348->super_Material).mSpecular,&local_360);
      aiColor3D::aiColor3D(&local_36c,0.05,0.05,0.05);
      aiColor3D::operator=(&(local_348->super_Material).mAmbient,&local_36c);
      (local_348->super_Material).mShading = Gouraud;
    }
    return;
  }
  __assert_fail("__null != mParser",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/ASE/ASELoader.cpp"
                ,0x10c,"void Assimp::ASEImporter::GenerateDefaultMaterial()");
}

Assistant:

void ASEImporter::GenerateDefaultMaterial()
{
    ai_assert(NULL != mParser);

    bool bHas = false;
    for (std::vector<ASE::Mesh>::iterator i =  mParser->m_vMeshes.begin();i != mParser->m_vMeshes.end();++i) {
        if ((*i).bSkip)continue;
        if (ASE::Face::DEFAULT_MATINDEX == (*i).iMaterialIndex) {
            (*i).iMaterialIndex = (unsigned int)mParser->m_vMaterials.size();
            bHas = true;
        }
    }
    if (bHas || mParser->m_vMaterials.empty())  {
        // add a simple material without submaterials to the parser's list
        mParser->m_vMaterials.push_back ( ASE::Material(AI_DEFAULT_MATERIAL_NAME) );
        ASE::Material& mat = mParser->m_vMaterials.back();

        mat.mDiffuse  = aiColor3D(0.6f,0.6f,0.6f);
        mat.mSpecular = aiColor3D(1.0f,1.0f,1.0f);
        mat.mAmbient  = aiColor3D(0.05f,0.05f,0.05f);
        mat.mShading  = Discreet3DS::Gouraud;
    }
}